

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O2

ai_real distance3D(aiVector3D *vA,aiVector3D *vB)

{
  float fVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = vB->x - vA->x;
  fVar3 = vB->y - vA->y;
  fVar4 = vB->z - vA->z;
  dVar2 = pow((double)(fVar4 * fVar4 + fVar1 * fVar1 + fVar3 * fVar3),0.5);
  return (float)dVar2;
}

Assistant:

static ai_real distance3D( const aiVector3D &vA, aiVector3D &vB ) {
    const ai_real lx = ( vB.x - vA.x );
    const ai_real ly = ( vB.y - vA.y );
    const ai_real lz = ( vB.z - vA.z );
    ai_real a = lx*lx + ly*ly + lz*lz;
    ai_real d = pow( a, (ai_real)0.5 );

    return d;
}